

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateCols(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  SPxOut *pSVar1;
  uint uVar2;
  undefined4 uVar3;
  DataArray<int> *pDVar4;
  type_conflict5 tVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  Verbosity VVar9;
  int *piVar10;
  char *pcVar11;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar12;
  element_type *peVar13;
  bool *pbVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  ulong *puVar17;
  int __c;
  int __c_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  undefined1 *in_RDX;
  DataArray<int> *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_6;
  int j_5;
  DataArray<int> da_perm;
  int j_4;
  int j_3;
  int *perm;
  int nColsOld;
  int j_2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_5;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_4;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_3;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_2;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objDif;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cj2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cj1;
  int j2;
  int j1;
  int m_1;
  int l_1;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int k_4;
  DataArray<int> m_perm_empty;
  bool hasDuplicateCol;
  int k_3;
  int k_2;
  DataArray<bool> fixAndRemCol;
  DataArray<bool> remCol;
  int l;
  int classIdx;
  ElementCompare compare;
  int k_1;
  int m;
  int j_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int k;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldVal;
  int j;
  IdxSet idxSet;
  SPxMemoryException *x;
  int *idxMem;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> classSize;
  DataArray<int> pClass;
  Result ret;
  int remNzos;
  int remCols;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  DuplicateColsPS *in_stack_ffffffffffffcee8;
  DuplicateColsPS *pDVar18;
  undefined4 in_stack_ffffffffffffcef0;
  undefined4 in_stack_ffffffffffffcef4;
  int in_stack_ffffffffffffcef8;
  int in_stack_ffffffffffffcefc;
  undefined7 in_stack_ffffffffffffcf00;
  undefined1 in_stack_ffffffffffffcf07;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffcf28;
  int **in_stack_ffffffffffffcf30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffcf78;
  undefined2 uVar19;
  DataArray<int> *in_stack_ffffffffffffcf80;
  undefined4 in_stack_ffffffffffffcf88;
  int in_stack_ffffffffffffcf8c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffcf90;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffcf98;
  DuplicateColsPS *in_stack_ffffffffffffcfa0;
  type_conflict5 local_301a;
  DataArray<int> *in_stack_ffffffffffffcfe8;
  undefined4 in_stack_ffffffffffffcff0;
  int in_stack_ffffffffffffcff4;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffd000;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffd008;
  ElementCompare *in_stack_ffffffffffffd010;
  int in_stack_ffffffffffffd01c;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd020;
  type_conflict5 local_2fb3;
  uint *in_stack_ffffffffffffd070;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd078;
  DataArray<int> *in_stack_ffffffffffffd080;
  type_conflict5 local_2f42;
  undefined4 in_stack_ffffffffffffd0f0;
  int in_stack_ffffffffffffd0f4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd0f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd100;
  type_conflict5 local_2edb;
  type_conflict5 local_2e82;
  type_conflict5 local_2e2a;
  type_conflict5 local_2dca;
  type_conflict5 local_2d72;
  bool local_2cda;
  bool local_2c1d;
  undefined1 local_2b7c [128];
  undefined4 local_2afc;
  Verbosity local_2af8;
  undefined1 local_2af1;
  undefined8 local_2ac8;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffd540;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd548;
  uint in_stack_ffffffffffffd554;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffd558;
  FixBoundsPS *in_stack_ffffffffffffd560;
  uint local_2a2c;
  DataArray<int> local_2a28;
  uint local_2a10;
  uint local_2a0c;
  long local_2a08;
  uint local_29fc;
  uint local_29f8;
  undefined1 local_2974 [128];
  undefined1 local_28f4 [131];
  undefined1 local_2871;
  undefined1 local_2860 [460];
  undefined1 local_2694 [128];
  uint local_2614;
  uint local_2610;
  undefined1 local_260c [44];
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffda20;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffda28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2588;
  ulong local_24e8;
  undefined1 local_24dc [128];
  undefined4 local_245c;
  undefined4 local_2458;
  undefined1 local_2451;
  undefined1 local_2440 [148];
  undefined4 local_23ac;
  undefined1 local_23a8 [128];
  undefined4 local_2328;
  undefined4 local_2324;
  ulong local_2320;
  undefined1 local_2318 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2298;
  undefined1 local_2218 [128];
  undefined1 local_2198 [128];
  ulong local_2118;
  undefined1 local_2110 [19];
  undefined1 in_stack_ffffffffffffdf03;
  int in_stack_ffffffffffffdf04;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffdf08;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffdf10;
  undefined1 local_2090 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2010;
  undefined1 local_1f90 [128];
  ulong local_1f10;
  undefined1 local_1f08 [128];
  undefined1 local_1e88 [128];
  ulong local_1e08;
  undefined1 local_1dfc [128];
  undefined4 local_1d7c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d78;
  undefined1 local_1cf8 [128];
  undefined1 local_1c78 [128];
  undefined1 local_1bf8 [128];
  undefined1 local_1b78 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1af8;
  undefined1 local_1a78 [128];
  ulong local_19f8;
  undefined1 local_19f0 [128];
  ulong local_1970;
  undefined1 local_1968 [128];
  ulong local_18e8;
  undefined1 local_18e0 [128];
  undefined4 local_1860;
  undefined1 local_1859;
  DuplicateColsPS local_1858;
  byte local_1559;
  undefined8 local_1548;
  undefined1 local_1540 [128];
  undefined1 local_14c0 [144];
  undefined8 local_1430;
  undefined1 local_1424 [128];
  undefined1 local_13a4 [256];
  undefined1 local_12a4 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1224;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_11a4;
  undefined1 local_1124 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10a4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1024;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fa4;
  int local_f24;
  int local_f20;
  uint local_f1c;
  uint local_f18;
  undefined1 local_f11;
  undefined1 local_f10 [400];
  DataArray<bool> local_d80 [6];
  undefined1 local_ce8 [128];
  undefined1 local_c68 [128];
  uint local_be8;
  int local_be4;
  Real local_bd0;
  undefined1 local_bc8 [256];
  int local_ac8;
  uint local_ac4;
  undefined1 local_ac0 [128];
  undefined8 local_a40;
  int local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a34;
  uint local_9b4;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_9b0;
  int local_9a4;
  undefined8 local_9a0;
  undefined1 local_998 [128];
  undefined8 local_918;
  int local_90c;
  undefined8 local_908;
  IdxSet local_900;
  int *local_8d8;
  DataArray<int> local_8a8;
  DataArray<int> local_890;
  Result local_874;
  int local_870;
  int local_86c;
  undefined1 *local_868;
  DataArray<int> *local_860;
  Result local_84c;
  undefined8 local_848;
  undefined8 *local_840;
  undefined1 *local_838;
  undefined8 local_830;
  Real *local_828;
  undefined1 *local_820;
  undefined8 local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  undefined8 local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  undefined8 *local_7e0;
  undefined1 *local_7d8;
  undefined8 local_7d0;
  undefined8 *local_7c8;
  undefined1 *local_7c0;
  undefined8 local_7b8;
  uint *local_7b0;
  uint *local_7a8;
  undefined8 local_7a0;
  uint *local_798;
  uint *local_790;
  undefined8 local_788;
  ulong *local_780;
  undefined1 *local_778;
  undefined8 local_770;
  ulong *local_768;
  undefined1 *local_760;
  undefined8 local_758;
  ulong *local_750;
  undefined1 *local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined1 *local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined8 local_708;
  undefined1 *local_700;
  undefined8 local_6f8;
  ulong *local_6f0;
  undefined1 *local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined1 *local_6d0;
  undefined8 local_6c8;
  ulong *local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined1 *local_6a0;
  undefined8 local_698;
  ulong *local_690;
  undefined1 *local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined1 *local_670;
  undefined8 local_668;
  ulong *local_660;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  ulong *local_630;
  undefined1 *local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined1 *local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined8 *local_5d0;
  undefined1 *local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_590;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_588;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_560;
  undefined1 *local_558;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_550;
  undefined1 *local_548;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_540;
  uint *local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_530;
  uint *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  int *local_518;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_510;
  undefined1 *local_508;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  uint *local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4f0;
  shared_ptr<soplex::Tolerances> *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4d0;
  undefined1 *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  undefined1 *local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  undefined1 *local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  undefined8 *local_490;
  undefined1 *local_488;
  undefined8 local_480;
  undefined8 local_478;
  ulong *local_470;
  undefined8 local_468;
  ulong *local_460;
  undefined8 local_458;
  ulong *local_450;
  undefined8 local_448;
  ulong *local_440;
  undefined8 local_438;
  ulong *local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  ulong *local_410;
  ulong *local_408;
  ulong *local_400;
  uint *local_3f8;
  uint *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  Real *local_3c8;
  undefined8 *local_3c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_3b1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_371;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_340;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_331;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  undefined1 *local_300;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2f1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2b1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_271;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_231;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined8 *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined8 *local_190;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_181;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_141;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  undefined1 *local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  uint *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  uint *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_86c = 0;
  local_870 = 0;
  local_868 = in_RDX;
  local_860 = in_RSI;
  local_874 = removeEmpty(in_stack_ffffffffffffda28,in_stack_ffffffffffffda20);
  local_84c = local_874;
  if (local_874 == OKAY) {
    iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x711753);
    if (iVar7 < 2) {
      local_84c = OKAY;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x711775);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8,
                 (Real)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x71179b);
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8,
                 (Real)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x7117d1);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
              in_stack_ffffffffffffcefc);
      local_8d8 = (int *)0x0;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x711809);
      spx_alloc<int*>(in_stack_ffffffffffffcf30,(int)((ulong)in_stack_ffffffffffffcf28 >> 0x20));
      iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x711940);
      IdxSet::IdxSet(&local_900,iVar7,local_8d8,0);
      piVar10 = DataArray<int>::operator[](&local_890,0);
      *piVar10 = 0;
      local_908 = 0;
      local_198 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                               (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
      local_1a0 = &local_908;
      local_190 = local_1a0;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_ffffffffffffd008,(double)in_stack_ffffffffffffd000);
      iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x7119f7);
      piVar10 = DataArray<int>::operator[](&local_8a8,0);
      *piVar10 = iVar7;
      for (local_90c = 1; iVar7 = local_90c,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x711a3e), iVar7 < iVar8; local_90c = local_90c + 1) {
        piVar10 = DataArray<int>::operator[](&local_890,local_90c);
        *piVar10 = 0;
        local_918 = 0;
        local_1b0 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
        local_1b8 = &local_918;
        local_1a8 = local_1b8;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  (in_stack_ffffffffffffd008,(double)in_stack_ffffffffffffd000);
        piVar10 = DataArray<int>::operator[](&local_8a8,local_90c);
        *piVar10 = 0;
        IdxSet::addIdx(&local_900,local_90c);
      }
      local_9a0 = 0;
      local_838 = local_998;
      local_840 = &local_9a0;
      local_848 = 0;
      local_3c0 = local_840;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                 (type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      for (local_9a4 = 0; iVar7 = local_9a4,
          iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x711be1), iVar7 < iVar8; local_9a4 = local_9a4 + 1) {
        local_9b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
        for (local_9b4 = 0; uVar2 = local_9b4,
            iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_9b0), (int)uVar2 < iVar7; local_9b4 = local_9b4 + 1) {
          local_5c0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::value(local_9b0,local_9b4);
          local_5b8 = &local_a34;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
          pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_9b0,(char *)(ulong)local_9b4,__c);
          local_a38 = (int)pcVar11;
          Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          local_a40 = 0;
          tVar5 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffcee8,(double *)0x711cf1);
          if (tVar5) {
            local_498 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
            local_4a0 = &local_a34;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
          }
          DataArray<int>::operator[](&local_890,local_a38);
          Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          local_330 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          local_328 = &local_a34;
          local_320 = local_ac0;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_331,local_328,local_330);
          local_318 = local_ac0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
          local_308 = local_328;
          local_310 = local_330;
          local_300 = local_ac0;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8,
                     (cpp_dec_float<200U,_int,_void> *)0x711e5b);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                in_stack_ffffffffffffcefc,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
          piVar10 = DataArray<int>::operator[](&local_890,local_a38);
          piVar10 = DataArray<int>::operator[](&local_8a8,*piVar10);
          iVar7 = *piVar10;
          *piVar10 = iVar7 + -1;
          if (iVar7 + -1 == 0) {
            piVar10 = DataArray<int>::operator[](&local_890,local_a38);
            IdxSet::addIdx(&local_900,*piVar10);
          }
        }
        for (local_ac4 = 0; uVar2 = local_ac4,
            iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_9b0), (int)uVar2 < iVar7; local_ac4 = local_ac4 + 1) {
          pcVar11 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::index(local_9b0,(char *)(ulong)local_ac4,__c_00);
          piVar10 = DataArray<int>::operator[](&local_890,(int)pcVar11);
          local_ac8 = *piVar10;
          pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(&pDVar12->
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        );
          if (0 < iVar7) {
            SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_ffffffffffffcee8);
            peVar13 = std::
                      __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x711fa7);
            local_bd0 = Tolerances::epsilon(peVar13);
            local_820 = local_bc8;
            local_828 = &local_bd0;
            local_830 = 0;
            local_3c8 = local_828;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                       (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                       (type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
            ElementCompare::ElementCompare
                      ((ElementCompare *)
                       CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x71204d);
            pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
            iVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(&pDVar12->
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          );
            iVar7 = extraout_EDX;
            if (1 < iVar8) {
              pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::mem(&pDVar12->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
              pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(&pDVar12->
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    );
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (in_stack_ffffffffffffd020,in_stack_ffffffffffffd01c,
                         in_stack_ffffffffffffd010,(int)((ulong)in_stack_ffffffffffffd008 >> 0x20),
                         SUB81((ulong)in_stack_ffffffffffffd008 >> 0x18,0));
              iVar7 = extraout_EDX_00;
            }
            pcVar11 = IdxSet::index(&local_900,(char *)0x0,iVar7);
            local_be4 = (int)pcVar11;
            IdxSet::remove(&local_900,(char *)0x0);
            local_be8 = 0;
            while( true ) {
              uVar2 = local_be8;
              pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
              iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar12->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              iVar8 = (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20);
              if (iVar7 <= (int)uVar2) break;
              local_2c1d = false;
              iVar7 = extraout_EDX_01;
              if (local_be8 != 0) {
                pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),iVar8);
                local_5b0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::value(&pDVar12->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,local_be8);
                local_5a8 = local_c68;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                local_598 = local_ce8;
                local_5a0 = local_998;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                          ((cpp_dec_float<200U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                           (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                epsZero(in_stack_ffffffffffffcf28);
                local_2c1d = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                       (in_stack_ffffffffffffd100,in_stack_ffffffffffffd0f8,
                                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)CONCAT44(in_stack_ffffffffffffd0f4,
                                                    in_stack_ffffffffffffd0f0));
                iVar7 = extraout_EDX_02;
              }
              if (local_2c1d != false) {
                pcVar11 = IdxSet::index(&local_900,(char *)0x0,iVar7);
                local_be4 = (int)pcVar11;
                IdxSet::remove(&local_900,(char *)0x0);
              }
              iVar7 = local_be4;
              pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
              piVar10 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::index(&pDVar12->
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ,(char *)(ulong)local_be8,__c_01);
              piVar10 = DataArray<int>::operator[](&local_890,*piVar10);
              *piVar10 = iVar7;
              piVar10 = DataArray<int>::operator[](&local_8a8,local_be4);
              *piVar10 = *piVar10 + 1;
              pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
              local_4b0 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::value(&pDVar12->
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,local_be8);
              local_4a8 = local_998;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                         (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
              local_be8 = local_be8 + 1;
            }
            Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),iVar8);
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x7123c0);
          }
        }
      }
      spx_free<int*>((int **)0x7123fd);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x71240a);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8,
                 (Real)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x712440);
      DataArray<bool>::DataArray
                ((DataArray<bool> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8,
                 (Real)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      for (local_f10._372_4_ = 0; uVar3 = local_f10._372_4_,
          iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x71248f), (int)uVar3 < iVar7;
          local_f10._372_4_ = local_f10._372_4_ + 1) {
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                     (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x7124d1);
      }
      for (local_f10._368_4_ = 0; uVar3 = local_f10._368_4_,
          iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x71253c), (int)uVar3 < iVar7;
          local_f10._368_4_ = local_f10._368_4_ + 1) {
        pbVar14 = DataArray<bool>::operator[](local_d80,local_f10._368_4_);
        *pbVar14 = false;
        pbVar14 = DataArray<bool>::operator[]
                            ((DataArray<bool> *)(local_f10 + 0x178),local_f10._368_4_);
        *pbVar14 = false;
        DataArray<int>::operator[](&local_890,local_f10._368_4_);
        Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                     (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
        local_f10._232_4_ = 0;
        local_f10._236_4_ = 0;
        local_808 = local_f10 + 0xf0;
        local_810 = local_f10 + 0xe8;
        local_818 = 0;
        local_3d0 = local_810;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                   (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                   (type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
              in_stack_ffffffffffffcefc,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      }
      local_f10[0xe7] = 0;
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8,
                 (Real)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      for (local_f10._196_4_ = 0; uVar3 = local_f10._196_4_,
          iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x7126c3), (int)uVar3 < iVar7;
          local_f10._196_4_ = local_f10._196_4_ + 1) {
        pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                               (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(&pDVar12->
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      );
        if (1 < iVar7) {
          pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(&pDVar12->
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(char *)0x0,__c_02);
          pSVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar15);
          if (iVar7 != 1) {
            pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
            local_f10._192_4_ =
                 SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::size(&pDVar12->
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
            SPxOut::
            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[37],_int,_0>
                      (in_RDI,(char (*) [37])"IMAISM58 {} duplicate columns found\n",
                       (int *)(local_f10 + 0xc0));
            if ((local_f10[0xe7] & 1) == 0) {
              operator_new(0x2d0);
              local_f11 = 1;
              local_f10._40_4_ = 0;
              local_f10._44_4_ = 0x3ff00000;
              local_7f0 = local_f10 + 0x30;
              local_7f8 = local_f10 + 0x28;
              local_800 = 0;
              local_3d8 = local_7f8;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<200U,_int,_void> *)
                         CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                         (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                         (type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
              DataArray<int>::DataArray
                        ((DataArray<int> *)
                         CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                         (DataArray<int> *)
                         CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8));
              pDVar18 = (DuplicateColsPS *)local_f10;
              std::shared_ptr<soplex::Tolerances>::shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)
                         CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                         (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8);
              in_stack_ffffffffffffcef8 = 0;
              in_stack_ffffffffffffcef0 = 1;
              DuplicateColsPS::DuplicateColsPS
                        (in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98,
                         (int)((ulong)in_stack_ffffffffffffcf90 >> 0x20),
                         (int)in_stack_ffffffffffffcf90,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                         in_stack_ffffffffffffcf80,in_stack_ffffffffffffd000,
                         SUB81((ulong)in_stack_ffffffffffffcf78 >> 0x38,0),
                         SUB81((ulong)in_stack_ffffffffffffcf78 >> 0x30,0));
              local_f11 = 0;
              std::
              shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
              ::
              shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                        ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),pDVar18);
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x71291d);
              DataArray<int>::~DataArray
                        ((DataArray<int> *)
                         CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
              Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
              ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                        *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                       (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                        *)pDVar18);
              local_f10[0xe7] = 1;
              std::
              shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
              ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                             *)0x71295d);
              in_stack_ffffffffffffcee8 = pDVar18;
            }
            local_f18 = 0;
            while( true ) {
              uVar2 = local_f18;
              pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
              iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::size(&pDVar12->
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            );
              if (iVar7 <= (int)uVar2) break;
              local_f1c = 0;
              while( true ) {
                uVar2 = local_f1c;
                pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::size(&pDVar12->
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              );
                if (iVar7 <= (int)uVar2) break;
                pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                piVar10 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::index(&pDVar12->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ,(char *)(ulong)local_f18,__c_03);
                local_f20 = *piVar10;
                pDVar12 = Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ::operator[]((Array<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                piVar10 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::index(&pDVar12->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ,(char *)(ulong)local_f1c,__c_04);
                local_f24 = *piVar10;
                if (((local_f18 != local_f1c) &&
                    (pbVar14 = DataArray<bool>::operator[](local_d80,local_f20),
                    (*pbVar14 & 1U) == 0)) &&
                   (pbVar14 = DataArray<bool>::operator[](local_d80,local_f24), (*pbVar14 & 1U) == 0
                   )) {
                  local_590 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                  local_588 = &local_fa4;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                  local_580 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                       (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                  local_578 = &local_1024;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                  pnVar16 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(in_stack_ffffffffffffcef4,
                                                     in_stack_ffffffffffffcef0),
                                         (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                  local_370 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(in_stack_ffffffffffffcef4,
                                                       in_stack_ffffffffffffcef0),
                                           (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                  local_368 = pnVar16;
                  local_360 = &local_10a4;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_371,pnVar16,local_370);
                  local_358 = &local_10a4;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
                  local_348 = local_368;
                  local_350 = local_370;
                  local_340 = &local_10a4;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8,
                             (cpp_dec_float<200U,_int,_void> *)0x712cd7);
                  local_1f0 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(in_stack_ffffffffffffcef4,
                                                       in_stack_ffffffffffffcef0),
                                           (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                  local_1e8 = &local_1024;
                  local_1e0 = &local_1224;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1f1,local_1e8,local_1f0);
                  local_1d8 = &local_1224;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
                  local_1c8 = local_1e8;
                  local_1d0 = local_1f0;
                  local_1c0 = &local_1224;
                  boost::multiprecision::default_ops::
                  eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8,
                             (cpp_dec_float<200U,_int,_void> *)0x712da6);
                  local_3b0 = Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)CONCAT44(in_stack_ffffffffffffcef4,
                                                       in_stack_ffffffffffffcef0),
                                           (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                  local_3a8 = &local_1224;
                  local_3a0 = &local_11a4;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_3b1,local_3a8,local_3b0);
                  local_398 = &local_11a4;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
                  local_388 = local_3a8;
                  local_390 = local_3b0;
                  local_380 = &local_11a4;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8,
                             (cpp_dec_float<200U,_int,_void> *)0x712e75);
                  local_178 = &local_fa4;
                  local_180 = &local_11a4;
                  local_170 = local_1124;
                  boost::multiprecision::detail::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                  ::
                  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_181,local_178,local_180);
                  local_168 = local_1124;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
                  local_158 = local_178;
                  local_160 = local_180;
                  local_150 = local_1124;
                  boost::multiprecision::default_ops::
                  eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8,
                             (cpp_dec_float<200U,_int,_void> *)0x712f38);
                  local_568 = local_12a4;
                  local_570 = local_1124;
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                            ((cpp_dec_float<200U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                             (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                  epsZero(in_stack_ffffffffffffcf28);
                  bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffcff4,in_stack_ffffffffffffcff0
                                                ),
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)in_stack_ffffffffffffcfe8);
                  iVar7 = (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20);
                  if (bVar6) {
                    local_1559 = 0;
                    local_1858.m_upK.m_backend.data._M_elems[0xb]._3_1_ = 0;
                    local_1858.m_upJ.m_backend.data._M_elems[3]._3_1_ = 0;
                    local_560 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_ffffffffffffcef4,
                                                    in_stack_ffffffffffffcef0),iVar7);
                    local_558 = local_13a4;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                    local_1430 = 0;
                    local_7d8 = local_1424;
                    local_7e0 = &local_1430;
                    local_7e8 = 0;
                    local_3e0 = local_7e0;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                               (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8)
                               ,(type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ));
                    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffcee8);
                    peVar13 = std::
                              __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)0x7130b4);
                    Tolerances::epsilon(peVar13);
                    bVar6 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                       (double)in_stack_ffffffffffffd070);
                    local_2cda = false;
                    if (bVar6) {
                      local_550 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0),
                                          (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                      local_548 = local_14c0;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                      local_1548 = 0;
                      local_7c0 = local_1540;
                      local_7c8 = &local_1548;
                      local_7d0 = 0;
                      local_3e8 = local_7c8;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<200U,_int,_void> *)
                                 CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                 (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                  in_stack_ffffffffffffcef8),
                                 (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                  in_stack_ffffffffffffcef0));
                      SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcee8);
                      local_1559 = 1;
                      peVar13 = std::
                                __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)0x7131f6);
                      Tolerances::epsilon(peVar13);
                      bVar6 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                         (double)in_stack_ffffffffffffd070);
                      local_2cda = false;
                      if (bVar6) {
                        local_540 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                        local_538 = local_1858.m_scale.m_backend.data._M_elems + 0x13;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                      (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                        local_1858.m_upK.m_backend.data._M_elems[0x10] = 0;
                        local_1858.m_upK.m_backend.data._M_elems[0x11] = 0;
                        local_7a8 = local_1858.m_upK.m_backend.data._M_elems + 0x13;
                        local_7b0 = local_1858.m_upK.m_backend.data._M_elems + 0x10;
                        local_7b8 = 0;
                        local_3f0 = local_7b0;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<200U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                   (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                    in_stack_ffffffffffffcef8),
                                   (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                    in_stack_ffffffffffffcef0));
                        SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffcee8);
                        local_1858.m_upK.m_backend.data._M_elems[0xb]._3_1_ = 1;
                        peVar13 = std::
                                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)0x713338);
                        Tolerances::epsilon(peVar13);
                        bVar6 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                           (double)in_stack_ffffffffffffd070);
                        local_2cda = false;
                        if (bVar6) {
                          local_530 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          local_528 = local_1858.m_loK.m_backend.data._M_elems + 0xb;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),
                                        (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8)
                          ;
                          local_1858.m_upJ.m_backend.data._M_elems[8] = 0;
                          local_1858.m_upJ.m_backend.data._M_elems[9] = 0;
                          local_790 = local_1858.m_upJ.m_backend.data._M_elems + 0xb;
                          local_798 = local_1858.m_upJ.m_backend.data._M_elems + 8;
                          local_7a0 = 0;
                          local_3f8 = local_798;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::tolerances((SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffcee8);
                          local_1858.m_upJ.m_backend.data._M_elems[3]._3_1_ = 1;
                          peVar13 = std::
                                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)0x71347a);
                          Tolerances::epsilon(peVar13);
                          local_2cda = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)in_stack_ffffffffffffd080,
                                                  in_stack_ffffffffffffd078,
                                                  (double)in_stack_ffffffffffffd070);
                        }
                      }
                    }
                    if ((local_1858.m_upJ.m_backend.data._M_elems[3]._3_1_ & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x7134eb);
                    }
                    if ((local_1858.m_upK.m_backend.data._M_elems[0xb]._3_1_ & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x713504);
                    }
                    if ((local_1559 & 1) != 0) {
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x71351d);
                    }
                    std::shared_ptr<soplex::Tolerances>::~shared_ptr
                              ((shared_ptr<soplex::Tolerances> *)0x71352a);
                    if (local_2cda == false) {
                      SPxOut::
                      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[95],_int_&,_int_&,_0>
                                (in_RDI,(char (*) [95])
                                        "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n"
                                 ,&local_f20,&local_f24);
                    }
                    else {
                      operator_new(0x2d0);
                      local_1859 = 1;
                      local_518 = &local_1858.m_j;
                      local_520 = &local_10a4;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                                ((cpp_dec_float<200U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                      DataArray<int>::DataArray
                                ((DataArray<int> *)
                                 CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                 (DataArray<int> *)
                                 CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8));
                      pDVar18 = &local_1858;
                      std::shared_ptr<soplex::Tolerances>::shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)
                                 CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8);
                      in_stack_ffffffffffffcef8 = 0;
                      in_stack_ffffffffffffcef0 = 0;
                      DuplicateColsPS::DuplicateColsPS
                                (in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98,
                                 (int)((ulong)in_stack_ffffffffffffcf90 >> 0x20),
                                 (int)in_stack_ffffffffffffcf90,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 in_stack_ffffffffffffcf80,in_stack_ffffffffffffd000,
                                 SUB81((ulong)in_stack_ffffffffffffcf78 >> 0x38,0),
                                 SUB81((ulong)in_stack_ffffffffffffcf78 >> 0x30,0));
                      local_1859 = 0;
                      std::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                      ::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 pDVar18);
                      std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                ((shared_ptr<soplex::Tolerances> *)0x71366f);
                      DataArray<int>::~DataArray
                                ((DataArray<int> *)
                                 CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
                      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                *)pDVar18);
                      local_1860 = 0;
                      tVar5 = boost::multiprecision::operator>
                                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffcefc,
                                                     in_stack_ffffffffffffcef8),
                                         (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                         in_stack_ffffffffffffcef0));
                      if (tVar5) {
                        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                (int)((ulong)pDVar18 >> 0x20));
                        puVar17 = (ulong *)infinity();
                        local_18e8 = *puVar17 ^ 0x8000000000000000;
                        local_778 = local_18e0;
                        local_780 = &local_18e8;
                        local_788 = 0;
                        local_400 = local_780;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<200U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                   (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                    in_stack_ffffffffffffcef8),
                                   (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                    in_stack_ffffffffffffcef0));
                        tVar5 = boost::multiprecision::operator<=
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)pDVar18,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x713780);
                        local_2d72 = true;
                        if (!tVar5) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                  (int)((ulong)pDVar18 >> 0x20));
                          puVar17 = (ulong *)infinity();
                          local_1970 = *puVar17 ^ 0x8000000000000000;
                          local_760 = local_1968;
                          local_768 = &local_1970;
                          local_770 = 0;
                          local_408 = local_768;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          local_2d72 = boost::multiprecision::operator<=
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar18,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x713851);
                        }
                        pDVar4 = local_860;
                        iVar7 = local_f24;
                        if (local_2d72 == false) {
                          pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)pDVar18 >> 0x20));
                          local_230 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)pDVar18 >> 0x20));
                          local_228 = &local_10a4;
                          local_220 = &local_1af8;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_231,local_228,local_230);
                          local_218 = &local_1af8;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ));
                          local_208 = local_228;
                          local_210 = local_230;
                          local_200 = &local_1af8;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                     (cpp_dec_float<200U,_int,_void> *)pDVar18,
                                     (cpp_dec_float<200U,_int,_void> *)0x713b91);
                          local_80 = &local_1af8;
                          local_78 = pnVar16;
                          local_70 = local_1a78;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_81,pnVar16,local_80);
                          local_68 = local_1a78;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ));
                          local_58 = local_78;
                          local_60 = local_80;
                          local_50 = local_1a78;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                     (cpp_dec_float<200U,_int,_void> *)pDVar18,
                                     (cpp_dec_float<200U,_int,_void> *)0x713c54);
                          (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,iVar7,local_1a78,0);
                        }
                        else {
                          puVar17 = (ulong *)infinity();
                          local_19f8 = *puVar17 ^ 0x8000000000000000;
                          local_748 = local_19f0;
                          local_750 = &local_19f8;
                          local_758 = 0;
                          local_410 = local_750;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,iVar7,local_19f0,0);
                        }
                        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                (int)((ulong)pDVar18 >> 0x20));
                        local_738 = infinity();
                        local_730 = local_1b78;
                        local_740 = 0;
                        local_418 = local_738;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<200U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                   (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                    in_stack_ffffffffffffcef8),
                                   (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                    in_stack_ffffffffffffcef0));
                        tVar5 = boost::multiprecision::operator>=
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)pDVar18,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x713d0e);
                        local_2dca = true;
                        if (!tVar5) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                  (int)((ulong)pDVar18 >> 0x20));
                          local_720 = infinity();
                          local_718 = local_1bf8;
                          local_728 = 0;
                          local_420 = local_720;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          local_2dca = boost::multiprecision::operator>=
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar18,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x713dbf);
                        }
                        pDVar4 = local_860;
                        iVar7 = local_f24;
                        if (local_2dca == false) {
                          pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)pDVar18 >> 0x20));
                          local_270 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)pDVar18 >> 0x20));
                          local_268 = &local_10a4;
                          local_260 = &local_1d78;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_271,local_268,local_270);
                          local_258 = &local_1d78;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ));
                          local_248 = local_268;
                          local_250 = local_270;
                          local_240 = &local_1d78;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                     (cpp_dec_float<200U,_int,_void> *)pDVar18,
                                     (cpp_dec_float<200U,_int,_void> *)0x713f96);
                          local_c0 = &local_1d78;
                          local_b8 = pnVar16;
                          local_b0 = local_1cf8;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_c1,pnVar16,local_c0);
                          local_a8 = local_1cf8;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ));
                          local_98 = local_b8;
                          local_a0 = local_c0;
                          local_90 = local_1cf8;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                     (cpp_dec_float<200U,_int,_void> *)pDVar18,
                                     (cpp_dec_float<200U,_int,_void> *)0x714059);
                          (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,iVar7,local_1cf8,0);
                        }
                        else {
                          local_708 = infinity();
                          local_700 = local_1c78;
                          local_710 = 0;
                          local_428 = local_708;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,iVar7,local_1c78,0);
                        }
                      }
                      else {
                        local_1d7c = 0;
                        tVar5 = boost::multiprecision::operator<
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffcefc,
                                                       in_stack_ffffffffffffcef8),
                                           (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                           in_stack_ffffffffffffcef0));
                        if (tVar5) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                  (int)((ulong)pDVar18 >> 0x20));
                          puVar17 = (ulong *)infinity();
                          local_1e08 = *puVar17 ^ 0x8000000000000000;
                          local_6e8 = local_1dfc;
                          local_6f0 = &local_1e08;
                          local_6f8 = 0;
                          local_430 = local_6f0;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          tVar5 = boost::multiprecision::operator<=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)pDVar18,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x714171);
                          local_2e2a = true;
                          if (!tVar5) {
                            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                    ,(int)((ulong)pDVar18 >> 0x20));
                            local_6d8 = infinity();
                            local_6d0 = local_1e88;
                            local_6e0 = 0;
                            local_438 = local_6d8;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00)
                                       ,(double)CONCAT44(in_stack_ffffffffffffcefc,
                                                         in_stack_ffffffffffffcef8),
                                       (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0));
                            local_2e2a = boost::multiprecision::operator>=
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar18,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x714222);
                          }
                          pDVar4 = local_860;
                          iVar7 = local_f24;
                          if (local_2e2a == false) {
                            pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)pDVar18 >> 0x20));
                            local_2b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)CONCAT44(in_stack_ffffffffffffcef4,
                                                            in_stack_ffffffffffffcef0),
                                                (int)((ulong)pDVar18 >> 0x20));
                            local_2a8 = &local_10a4;
                            local_2a0 = &local_2010;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_2b1,local_2a8,local_2b0);
                            local_298 = &local_2010;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0));
                            local_288 = local_2a8;
                            local_290 = local_2b0;
                            local_280 = &local_2010;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                       ,(cpp_dec_float<200U,_int,_void> *)pDVar18,
                                       (cpp_dec_float<200U,_int,_void> *)0x714419);
                            local_100 = &local_2010;
                            local_f8 = pnVar16;
                            local_f0 = local_1f90;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_101,pnVar16,local_100);
                            local_e8 = local_1f90;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0));
                            local_d8 = local_f8;
                            local_e0 = local_100;
                            local_d0 = local_1f90;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                       ,(cpp_dec_float<200U,_int,_void> *)pDVar18,
                                       (cpp_dec_float<200U,_int,_void> *)0x7144dc);
                            (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,iVar7,local_1f90,0);
                          }
                          else {
                            puVar17 = (ulong *)infinity();
                            local_1f10 = *puVar17 ^ 0x8000000000000000;
                            local_6b8 = local_1f08;
                            local_6c0 = &local_1f10;
                            local_6c8 = 0;
                            local_440 = local_6c0;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00)
                                       ,(double)CONCAT44(in_stack_ffffffffffffcefc,
                                                         in_stack_ffffffffffffcef8),
                                       (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0));
                            (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,iVar7,local_1f08,0);
                          }
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                  (int)((ulong)pDVar18 >> 0x20));
                          local_6a8 = infinity();
                          local_6a0 = local_2090;
                          local_6b0 = 0;
                          local_448 = local_6a8;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          tVar5 = boost::multiprecision::operator>=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)pDVar18,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x714596);
                          local_2e82 = true;
                          if (!tVar5) {
                            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                    ,(int)((ulong)pDVar18 >> 0x20));
                            puVar17 = (ulong *)infinity();
                            local_2118 = *puVar17 ^ 0x8000000000000000;
                            local_688 = local_2110;
                            local_690 = &local_2118;
                            local_698 = 0;
                            local_450 = local_690;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00)
                                       ,(double)CONCAT44(in_stack_ffffffffffffcefc,
                                                         in_stack_ffffffffffffcef8),
                                       (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0));
                            local_2e82 = boost::multiprecision::operator<=
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)pDVar18,
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x714667);
                          }
                          pDVar4 = local_860;
                          iVar7 = local_f24;
                          if (local_2e82 == false) {
                            pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)pDVar18 >> 0x20));
                            local_2f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)CONCAT44(in_stack_ffffffffffffcef4,
                                                            in_stack_ffffffffffffcef0),
                                                (int)((ulong)pDVar18 >> 0x20));
                            local_2e8 = &local_10a4;
                            local_2e0 = &local_2298;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_2f1,local_2e8,local_2f0);
                            local_2d8 = &local_2298;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0));
                            local_2c8 = local_2e8;
                            local_2d0 = local_2f0;
                            local_2c0 = &local_2298;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                       ,(cpp_dec_float<200U,_int,_void> *)pDVar18,
                                       (cpp_dec_float<200U,_int,_void> *)0x71483e);
                            local_140 = &local_2298;
                            local_138 = pnVar16;
                            local_130 = local_2218;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_141,pnVar16,local_140);
                            local_128 = local_2218;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0));
                            local_118 = local_138;
                            local_120 = local_140;
                            local_110 = local_2218;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                       ,(cpp_dec_float<200U,_int,_void> *)pDVar18,
                                       (cpp_dec_float<200U,_int,_void> *)0x714901);
                            (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,iVar7,local_2218,0);
                          }
                          else {
                            local_678 = infinity();
                            local_670 = local_2198;
                            local_680 = 0;
                            local_458 = local_678;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00)
                                       ,(double)CONCAT44(in_stack_ffffffffffffcefc,
                                                         in_stack_ffffffffffffcef8),
                                       (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0));
                            (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,iVar7,local_2198,0);
                          }
                        }
                      }
                      SPxOut::
                      debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[55],_int_&,_int_&,_0>
                                (in_RDI,(char (*) [55])
                                        "IMAISM60 two duplicate columns {}, {} replaced by one\n",
                                 &local_f20,&local_f24);
                      pbVar14 = DataArray<bool>::operator[](local_d80,local_f20);
                      *pbVar14 = true;
                      piVar10 = DataArray<int>::operator[](&in_RDI->m_stat,0xe);
                      *piVar10 = *piVar10 + 1;
                      std::
                      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                     *)0x71499c);
                      in_stack_ffffffffffffcee8 = pDVar18;
                    }
                  }
                  else {
                    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),iVar7);
                    puVar17 = (ulong *)infinity();
                    local_2320 = *puVar17 ^ 0x8000000000000000;
                    local_658 = local_2318;
                    local_660 = &local_2320;
                    local_668 = 0;
                    local_460 = local_660;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                    cpp_dec_float<double>
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                               (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8)
                               ,(type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ));
                    tVar5 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)in_stack_ffffffffffffcee8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)0x714a78);
                    if (tVar5) {
                      local_2324 = 0;
                      tVar5 = boost::multiprecision::operator>
                                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffcefc,
                                                     in_stack_ffffffffffffcef8),
                                         (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                         in_stack_ffffffffffffcef0));
                      local_2edb = false;
                      if (tVar5) {
                        local_2328 = 0;
                        local_2edb = boost::multiprecision::operator>
                                               ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)CONCAT44(in_stack_ffffffffffffcefc,
                                                            in_stack_ffffffffffffcef8),
                                                (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                                in_stack_ffffffffffffcef0));
                      }
                      if (local_2edb == false) {
                        local_2458 = 0;
                        tVar5 = boost::multiprecision::operator<
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffcefc,
                                                       in_stack_ffffffffffffcef8),
                                           (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                           in_stack_ffffffffffffcef0));
                        local_2f42 = false;
                        if (tVar5) {
                          local_245c = 0;
                          local_2f42 = boost::multiprecision::operator<
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcefc,
                                                             in_stack_ffffffffffffcef8),
                                                  (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                                  in_stack_ffffffffffffcef0));
                        }
                        if (local_2f42 != false) {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                  (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          puVar17 = (ulong *)infinity();
                          local_24e8 = *puVar17 ^ 0x8000000000000000;
                          local_628 = local_24dc;
                          local_630 = &local_24e8;
                          local_638 = 0;
                          local_470 = local_630;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          tVar5 = boost::multiprecision::operator<=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffcee8,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x714f76);
                          if (tVar5) {
                            SPxOut::
                            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                      (in_RDI,(char (*) [23])"IMAISM76 LP unbounded\n");
                            local_84c = UNBOUNDED;
                            local_23ac = 1;
                            goto LAB_00716354;
                          }
                          pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          SPxOut::
                          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                    (in_RDI,(char (*) [73])
                                            "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n"
                                     ,&local_f20,&local_f24,pnVar16);
                          operator_new(0x30);
                          in_stack_ffffffffffffd080 = local_860;
                          local_500 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          in_stack_ffffffffffffd070 = local_2588.m_backend.data._M_elems + 4;
                          local_4f8 = in_stack_ffffffffffffd070;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),
                                        (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8)
                          ;
                          in_stack_ffffffffffffd078 = &local_2588;
                          std::shared_ptr<soplex::Tolerances>::shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)
                                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8);
                          FixBoundsPS::FixBoundsPS
                                    (in_stack_ffffffffffffd560,in_stack_ffffffffffffd558,
                                     in_stack_ffffffffffffd554,in_stack_ffffffffffffd548,
                                     in_stack_ffffffffffffd540);
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                          ::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(FixBoundsPS *)in_stack_ffffffffffffcee8);
                          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)0x71510b);
                          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                    *)in_stack_ffffffffffffcee8);
                          pDVar4 = local_860;
                          iVar7 = local_f20;
                          pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          (**(code **)(*(long *)pDVar4 + 0x168))(pDVar4,iVar7,pnVar16,0);
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                         *)0x71518a);
                        }
                      }
                      else {
                        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                        local_648 = infinity();
                        local_640 = local_23a8;
                        local_650 = 0;
                        local_468 = local_648;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float<double>
                                  ((cpp_dec_float<200U,_int,_void> *)
                                   CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                   (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                    in_stack_ffffffffffffcef8),
                                   (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                    in_stack_ffffffffffffcef0));
                        tVar5 = boost::multiprecision::operator>=
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)in_stack_ffffffffffffcee8,
                                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x714ba7);
                        if (tVar5) {
                          SPxOut::
                          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                    (in_RDI,(char (*) [23])"IMAISM75 LP unbounded\n");
                          local_84c = UNBOUNDED;
                          local_23ac = 1;
                          goto LAB_00716354;
                        }
                        pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0),
                                          (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                        SPxOut::
                        debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                  (in_RDI,(char (*) [73])
                                          "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n"
                                   ,&local_f20,&local_f24,pnVar16);
                        in_stack_ffffffffffffd100 =
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)operator_new(0x30);
                        local_2451 = 1;
                        in_stack_ffffffffffffd0f4 = local_f20;
                        in_stack_ffffffffffffd0f8 =
                             SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                        local_508 = local_2440;
                        local_510 = in_stack_ffffffffffffd0f8;
                        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                        cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                      (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                        std::shared_ptr<soplex::Tolerances>::shared_ptr
                                  ((shared_ptr<soplex::Tolerances> *)
                                   CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8);
                        FixBoundsPS::FixBoundsPS
                                  (in_stack_ffffffffffffd560,in_stack_ffffffffffffd558,
                                   in_stack_ffffffffffffd554,in_stack_ffffffffffffd548,
                                   in_stack_ffffffffffffd540);
                        local_2451 = 0;
                        std::
                        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                        ::
                        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                  ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (FixBoundsPS *)in_stack_ffffffffffffcee8);
                        std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                  ((shared_ptr<soplex::Tolerances> *)0x714d3c);
                        Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                        ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                  *)in_stack_ffffffffffffcee8);
                        pDVar4 = local_860;
                        iVar7 = local_f20;
                        pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0),
                                          (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                        (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,iVar7,pnVar16,0);
                        std::
                        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                        ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                       *)0x714dbb);
                      }
                    }
                    else {
                      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                              (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                      local_618 = infinity();
                      local_610 = local_260c;
                      local_620 = 0;
                      local_478 = local_618;
                      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                      cpp_dec_float<double>
                                ((cpp_dec_float<200U,_int,_void> *)
                                 CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                 (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                  in_stack_ffffffffffffcef8),
                                 (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                  in_stack_ffffffffffffcef0));
                      tVar5 = boost::multiprecision::operator>=
                                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)in_stack_ffffffffffffcee8,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)0x7152a3);
                      if (tVar5) {
                        local_2610 = 0;
                        tVar5 = boost::multiprecision::operator<
                                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffcefc,
                                                       in_stack_ffffffffffffcef8),
                                           (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                           in_stack_ffffffffffffcef0));
                        local_2fb3 = false;
                        if (tVar5) {
                          local_2614 = 0;
                          local_2fb3 = boost::multiprecision::operator>
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcefc,
                                                             in_stack_ffffffffffffcef8),
                                                  (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                                  in_stack_ffffffffffffcef0));
                        }
                        if (local_2fb3 == false) {
                          local_2860._288_4_ = 0;
                          tVar5 = boost::multiprecision::operator>
                                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)CONCAT44(in_stack_ffffffffffffcefc,
                                                         in_stack_ffffffffffffcef8),
                                             (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                             in_stack_ffffffffffffcef0));
                          local_301a = false;
                          if (tVar5) {
                            local_2860._284_4_ = 0;
                            local_301a = boost::multiprecision::operator<
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcefc,
                                                             in_stack_ffffffffffffcef8),
                                                  (int *)CONCAT44(in_stack_ffffffffffffcef4,
                                                                  in_stack_ffffffffffffcef0));
                          }
                          if (local_301a != false) {
                            SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                    ,(int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                            puVar17 = (ulong *)infinity();
                            local_2860._144_8_ = *puVar17 ^ 0x8000000000000000;
                            local_5e0 = local_2860 + 0x9c;
                            local_5e8 = local_2860 + 0x90;
                            local_5f0 = 0;
                            local_488 = local_5e8;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float<double>
                                      ((cpp_dec_float<200U,_int,_void> *)
                                       CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00)
                                       ,(double)CONCAT44(in_stack_ffffffffffffcefc,
                                                         in_stack_ffffffffffffcef8),
                                       (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0));
                            tVar5 = boost::multiprecision::operator<=
                                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)in_stack_ffffffffffffcee8,
                                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x7157a1);
                            if (tVar5) {
                              SPxOut::
                              debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                        (in_RDI,(char (*) [23])"IMAISM78 LP unbounded\n");
                              local_84c = UNBOUNDED;
                              local_23ac = 1;
                              goto LAB_00716354;
                            }
                            pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                            SPxOut::
                            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[73],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                      (in_RDI,(char (*) [73])
                                              "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n"
                                       ,&local_f20,&local_f24,pnVar16);
                            operator_new(0x30);
                            local_2871 = 1;
                            local_4e0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)CONCAT44(in_stack_ffffffffffffcef4,
                                                            in_stack_ffffffffffffcef0),
                                                (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                            in_stack_ffffffffffffcf98 =
                                 (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)local_2860;
                            local_4d8 = in_stack_ffffffffffffcf98;
                            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                            cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                          (cpp_dec_float<200U,_int,_void> *)
                                          in_stack_ffffffffffffcee8);
                            in_stack_ffffffffffffcfa0 = (DuplicateColsPS *)&stack0xffffffffffffd790;
                            std::shared_ptr<soplex::Tolerances>::shared_ptr
                                      ((shared_ptr<soplex::Tolerances> *)
                                       CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                                       ,(shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8)
                            ;
                            FixBoundsPS::FixBoundsPS
                                      (in_stack_ffffffffffffd560,in_stack_ffffffffffffd558,
                                       in_stack_ffffffffffffd554,in_stack_ffffffffffffd548,
                                       in_stack_ffffffffffffd540);
                            local_2871 = 0;
                            std::
                            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                            ::
                            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                      ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                        *)CONCAT44(in_stack_ffffffffffffcef4,
                                                   in_stack_ffffffffffffcef0),
                                       (FixBoundsPS *)in_stack_ffffffffffffcee8);
                            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                      ((shared_ptr<soplex::Tolerances> *)0x715936);
                            Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                            ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),
                                     (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                      *)in_stack_ffffffffffffcee8);
                            in_stack_ffffffffffffcf80 = local_860;
                            in_stack_ffffffffffffcf8c = local_f20;
                            in_stack_ffffffffffffcf90 =
                                 SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(in_stack_ffffffffffffcef4,
                                                     in_stack_ffffffffffffcef0),
                                         (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                            (**(code **)(*(long *)in_stack_ffffffffffffcf80 + 0x168))
                                      (in_stack_ffffffffffffcf80,in_stack_ffffffffffffcf8c,
                                       in_stack_ffffffffffffcf90,0);
                            std::
                            shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                            ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                           *)0x7159b5);
                          }
                        }
                        else {
                          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                  (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          local_600 = infinity();
                          local_5f8 = local_2694;
                          local_608 = 0;
                          local_480 = local_600;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float<double>
                                    ((cpp_dec_float<200U,_int,_void> *)
                                     CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                                     (double)CONCAT44(in_stack_ffffffffffffcefc,
                                                      in_stack_ffffffffffffcef8),
                                     (type *)CONCAT44(in_stack_ffffffffffffcef4,
                                                      in_stack_ffffffffffffcef0));
                          tVar5 = boost::multiprecision::operator>=
                                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)in_stack_ffffffffffffcee8,
                                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x7153d2);
                          if (tVar5) {
                            SPxOut::
                            debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[23],_0>
                                      (in_RDI,(char (*) [23])"IMAISM77 LP unbounded\n");
                            local_84c = UNBOUNDED;
                            local_23ac = 1;
                            goto LAB_00716354;
                          }
                          pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          SPxOut::
                          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[75],_int_&,_int_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                                    (in_RDI,(char (*) [75])
                                            "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n"
                                     ,&local_f20,&local_f24,pnVar16);
                          operator_new(0x30);
                          local_2860[0x127] = 1;
                          local_4f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                               *)CONCAT44(in_stack_ffffffffffffcef4,
                                                          in_stack_ffffffffffffcef0),
                                              (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          in_stack_ffffffffffffd000 =
                               (shared_ptr<soplex::Tolerances> *)(local_2860 + 0x138);
                          local_4e8 = in_stack_ffffffffffffd000;
                          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                          cpp_dec_float((cpp_dec_float<200U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),
                                        (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8)
                          ;
                          std::shared_ptr<soplex::Tolerances>::shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)
                                     CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8);
                          FixBoundsPS::FixBoundsPS
                                    (in_stack_ffffffffffffd560,in_stack_ffffffffffffd558,
                                     in_stack_ffffffffffffd554,in_stack_ffffffffffffd548,
                                     in_stack_ffffffffffffd540);
                          local_2860[0x127] = 0;
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
                          ::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS,void>
                                    ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                      *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0
                                                ),(FixBoundsPS *)in_stack_ffffffffffffcee8);
                          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                                    ((shared_ptr<soplex::Tolerances> *)0x715567);
                          Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                   (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                    *)in_stack_ffffffffffffcee8);
                          in_stack_ffffffffffffcfe8 = local_860;
                          in_stack_ffffffffffffcff4 = local_f20;
                          pnVar16 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             *)CONCAT44(in_stack_ffffffffffffcef4,
                                                        in_stack_ffffffffffffcef0),
                                            (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                          (**(code **)(*(long *)in_stack_ffffffffffffcfe8 + 0x150))
                                    (in_stack_ffffffffffffcfe8,in_stack_ffffffffffffcff4,pnVar16,0);
                          std::
                          shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                          ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                                         *)0x7155e6);
                        }
                      }
                    }
                    in_stack_ffffffffffffcf78 =
                         SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                 (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                    local_4c8 = local_28f4;
                    local_4d0 = in_stack_ffffffffffffcf78;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                    local_4c0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(in_stack_ffffffffffffcef4,
                                                    in_stack_ffffffffffffcef0),
                                        (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
                    local_4b8 = local_2974;
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                              ((cpp_dec_float<200U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffcee8);
                    feastol(in_stack_ffffffffffffcf28);
                    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffd100,in_stack_ffffffffffffd0f8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT44(in_stack_ffffffffffffd0f4,
                                                   in_stack_ffffffffffffd0f0));
                    if (bVar6) {
                      pbVar14 = DataArray<bool>::operator[](local_d80,local_f20);
                      *pbVar14 = true;
                      pbVar14 = DataArray<bool>::operator[]
                                          ((DataArray<bool> *)(local_f10 + 0x178),local_f20);
                      *pbVar14 = true;
                      piVar10 = DataArray<int>::operator[](&in_RDI->m_stat,0xd);
                      *piVar10 = *piVar10 + 1;
                    }
                  }
                }
                local_f1c = local_f1c + 1;
              }
              local_f18 = local_f18 + 1;
            }
          }
        }
      }
      local_29f8 = 0;
      while( true ) {
        uVar2 = local_29f8;
        iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x715bef);
        iVar8 = (int)((ulong)in_stack_ffffffffffffcf28 >> 0x20);
        if (iVar7 <= (int)uVar2) break;
        pbVar14 = DataArray<bool>::operator[]((DataArray<bool> *)(local_f10 + 0x178),local_29f8);
        if ((*pbVar14 & 1U) != 0) {
          fixColumn(in_stack_ffffffffffffdf10,in_stack_ffffffffffffdf08,in_stack_ffffffffffffdf04,
                    (bool)in_stack_ffffffffffffdf03);
        }
        local_29f8 = local_29f8 + 1;
      }
      local_29fc = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x715c64);
      local_2a08 = 0;
      spx_alloc<int*>(in_stack_ffffffffffffcf30,iVar8);
      for (local_2a0c = 0; (int)local_2a0c < (int)local_29fc; local_2a0c = local_2a0c + 1) {
        pbVar14 = DataArray<bool>::operator[](local_d80,local_2a0c);
        if ((*pbVar14 & 1U) == 0) {
          *(undefined4 *)(local_2a08 + (long)(int)local_2a0c * 4) = 0;
        }
        else {
          *(undefined4 *)(local_2a08 + (long)(int)local_2a0c * 4) = 0xffffffff;
          local_86c = local_86c + 1;
          pSVar15 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::colVector((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                                (int)((ulong)in_stack_ffffffffffffcee8 >> 0x20));
          iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::size(pSVar15);
          local_870 = iVar7 + local_870;
        }
      }
      (**(code **)(*(long *)local_860 + 0xb8))(local_860,local_2a08);
      for (local_2a10 = 0; (int)local_2a10 < (int)local_29fc; local_2a10 = local_2a10 + 1) {
        if (-1 < *(int *)(local_2a08 + (long)(int)local_2a10 * 4)) {
          piVar10 = DataArray<int>::operator[](&in_RDI->m_cIdx,local_2a10);
          iVar7 = *piVar10;
          piVar10 = DataArray<int>::operator[]
                              (&in_RDI->m_cIdx,*(int *)(local_2a08 + (long)(int)local_2a10 * 4));
          *piVar10 = iVar7;
        }
      }
      DataArray<int>::DataArray
                ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                 in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8,
                 (Real)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      for (local_2a2c = 0; uVar19 = (undefined2)((ulong)in_stack_ffffffffffffcf78 >> 0x30),
          (int)local_2a2c < (int)local_29fc; local_2a2c = local_2a2c + 1) {
        iVar7 = *(int *)(local_2a08 + (long)(int)local_2a2c * 4);
        piVar10 = DataArray<int>::operator[](&local_2a28,local_2a2c);
        *piVar10 = iVar7;
      }
      pDVar18 = in_stack_ffffffffffffcee8;
      if ((local_f10[0xe7] & 1) != 0) {
        operator_new(0x2d0);
        local_2af1 = 1;
        local_2ac8._0_4_ = 0;
        local_2ac8._4_4_ = 0x3ff00000;
        local_5c8 = &stack0xffffffffffffd540;
        local_5d0 = &local_2ac8;
        local_5d8 = 0;
        local_490 = local_5d0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                   (double)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                   (type *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
        DataArray<int>::DataArray
                  ((DataArray<int> *)CONCAT17(in_stack_ffffffffffffcf07,in_stack_ffffffffffffcf00),
                   (DataArray<int> *)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8));
        pDVar18 = (DuplicateColsPS *)&stack0xffffffffffffd510;
        std::shared_ptr<soplex::Tolerances>::shared_ptr
                  ((shared_ptr<soplex::Tolerances> *)
                   CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                   (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffcee8);
        in_stack_ffffffffffffcef8 = 1;
        in_stack_ffffffffffffcef0 = 0;
        DuplicateColsPS::DuplicateColsPS
                  (in_stack_ffffffffffffcfa0,in_stack_ffffffffffffcf98,
                   (int)((ulong)in_stack_ffffffffffffcf90 >> 0x20),(int)in_stack_ffffffffffffcf90,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                   in_stack_ffffffffffffcf80,in_stack_ffffffffffffd000,SUB21((ushort)uVar19 >> 8,0),
                   SUB21(uVar19,0));
        local_2af1 = 0;
        std::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
        ::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateColsPS,void>
                  ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),pDVar18);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x715fd0)
        ;
        DataArray<int>::~DataArray
                  ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
        Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
        ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                  *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                 (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)pDVar18);
        std::
        shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
        ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                       *)0x716008);
      }
      spx_free<int*>((int **)0x7160bd);
      if (0 < local_86c) {
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remCols = local_86c +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remCols;
        (in_RDI->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_remNzos = local_870 +
                      (in_RDI->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_remNzos;
        if (((in_RDI->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout != (SPxOut *)0x0) &&
           (VVar9 = SPxOut::getVerbosity
                              ((in_RDI->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout), 3 < (int)VVar9)) {
          local_2af8 = SPxOut::getVerbosity
                                 ((in_RDI->
                                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          local_2afc = 4;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2afc);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                             ,(char *)pDVar18);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                             ,(int)((ulong)pDVar18 >> 0x20));
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                             ,(char *)pDVar18);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                             ,(int)((ulong)pDVar18 >> 0x20));
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                             ,(char *)pDVar18);
          soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0)
                             ,(_func_ostream_ptr_ostream_ptr *)pDVar18);
          pSVar1 = (in_RDI->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_2af8);
        }
        local_30 = &(in_RDI->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction;
        local_38 = &local_29fc;
        local_28 = local_2b7c;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_39,local_30);
        local_20 = local_2b7c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
        local_10 = local_30;
        local_18 = local_38;
        local_48 = (long)(int)*local_38;
        local_8 = local_2b7c;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0),
                   (cpp_dec_float<200U,_int,_void> *)pDVar18,(longlong *)0x7162ea);
        tVar5 = boost::multiprecision::operator>
                          ((int *)CONCAT44(in_stack_ffffffffffffcefc,in_stack_ffffffffffffcef8),
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
        if (tVar5) {
          *local_868 = 1;
        }
      }
      local_84c = OKAY;
      local_23ac = 1;
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
LAB_00716354:
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      DataArray<bool>::~DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      DataArray<bool>::~DataArray
                ((DataArray<bool> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      IdxSet::~IdxSet((IdxSet *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x716395);
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
      DataArray<int>::~DataArray
                ((DataArray<int> *)CONCAT44(in_stack_ffffffffffffcef4,in_stack_ffffffffffffcef0));
    }
  }
  return local_84c;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}